

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O1

void __thiscall
wallet::DescriptorScriptPubKeyMan::DescriptorScriptPubKeyMan
          (DescriptorScriptPubKeyMan *this,WalletStorage *storage,int64_t keypool_size)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  uint256 *puVar3;
  base_blob<256U> *pbVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ScriptPubKeyMan::ScriptPubKeyMan(&this->super_ScriptPubKeyMan,storage);
  (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan =
       (_func_int **)&PTR__DescriptorScriptPubKeyMan_013e0ee8;
  p_Var1 = &(this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_max_cached_index = -1;
  p_Var1 = &(this->m_map_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_decryption_thoroughly_checked = false;
  this->m_keypool_size = keypool_size;
  p_Var1 = &(this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined8 *)((long)&(this->m_wallet_descriptor).creation_time + 4) = 0;
  (this->m_wallet_descriptor).range_end = 0;
  (this->m_wallet_descriptor).next_index = 0;
  pbVar4 = &(this->m_wallet_descriptor).id.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  (this->m_wallet_descriptor).creation_time = 0;
  pbVar4 = &(this->m_wallet_descriptor).id.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  pbVar4 = &(this->m_wallet_descriptor).id.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  (this->m_wallet_descriptor).descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar3 = &(this->m_wallet_descriptor).id;
  (puVar3->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_wallet_descriptor).descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_wallet_descriptor).cache.m_derived_xpubs._M_h._M_buckets =
       &(this->m_wallet_descriptor).cache.m_derived_xpubs._M_h._M_single_bucket;
  (this->m_wallet_descriptor).cache.m_derived_xpubs._M_h._M_bucket_count = 1;
  (this->m_wallet_descriptor).cache.m_derived_xpubs._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->m_wallet_descriptor).cache.m_derived_xpubs._M_h._M_element_count = 0;
  (this->m_wallet_descriptor).cache.m_derived_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_wallet_descriptor).cache.m_derived_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_wallet_descriptor).cache.m_derived_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_wallet_descriptor).cache.m_parent_xpubs._M_h._M_buckets =
       &(this->m_wallet_descriptor).cache.m_parent_xpubs._M_h._M_single_bucket;
  (this->m_wallet_descriptor).cache.m_parent_xpubs._M_h._M_bucket_count = 1;
  (this->m_wallet_descriptor).cache.m_parent_xpubs._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->m_wallet_descriptor).cache.m_parent_xpubs._M_h._M_element_count = 0;
  (this->m_wallet_descriptor).cache.m_parent_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_wallet_descriptor).cache.m_parent_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_wallet_descriptor).cache.m_parent_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_wallet_descriptor).cache.m_last_hardened_xpubs._M_h._M_buckets =
       &(this->m_wallet_descriptor).cache.m_last_hardened_xpubs._M_h._M_single_bucket;
  (this->m_wallet_descriptor).cache.m_last_hardened_xpubs._M_h._M_bucket_count = 1;
  (this->m_wallet_descriptor).cache.m_last_hardened_xpubs._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->m_wallet_descriptor).cache.m_last_hardened_xpubs._M_h._M_element_count = 0;
  (this->m_wallet_descriptor).cache.m_last_hardened_xpubs._M_h._M_rehash_policy._M_max_load_factor =
       1.0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    *(undefined8 *)
     ((long)&(this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 0x10)
         = 0;
    (this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
    __prev = (__pthread_internal_list *)0x0;
    (this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
    *(undefined8 *)
     ((long)&(this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8) =
         0;
    (this->m_wallet_descriptor).cache.m_last_hardened_xpubs._M_h._M_rehash_policy._M_next_resize = 0
    ;
    (this->m_wallet_descriptor).cache.m_last_hardened_xpubs._M_h._M_single_bucket =
         (__node_base_ptr)0x0;
    (this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
    __next = (__pthread_internal_list *)0x0;
    (this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind =
         1;
    return;
  }
  __stack_chk_fail();
}

Assistant:

DescriptorScriptPubKeyMan(WalletStorage& storage, int64_t keypool_size)
        :   ScriptPubKeyMan(storage),
            m_keypool_size(keypool_size)
        {}